

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

bool __thiscall TimerHeap::setTime(TimerHeap *this,timeType_ *now,timeType_ *time)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Logger local_ff0;
  
  lVar3 = time->sec;
  lVar4 = time->msec;
  if (lVar4 != 0 && lVar3 != 0) {
    bVar1 = Timer::timeType_::operator<(time,now);
    if (bVar1) {
      Logger::Logger(&local_ff0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                     ,0x92);
      LogStream::operator<<((LogStream *)&local_ff0,"Timer error ");
      Logger::~Logger(&local_ff0);
      return false;
    }
    lVar3 = time->sec;
    lVar4 = time->msec;
  }
  (this->howlong_).it_value.tv_sec = lVar3;
  (this->howlong_).it_value.tv_nsec = lVar4 * 1000000;
  iVar2 = timerfd_settime(this->timerfd_,1,(itimerspec *)&this->howlong_,(itimerspec *)0x0);
  return iVar2 != -1;
}

Assistant:

bool TimerHeap::setTime(const Timer::timeType_& now, const Timer::timeType_& time) {
    if (time.sec != 0 && time.msec != 0 && time < now) {
        LOG <<"Timer error ";
        return false;
    }
    howlong_.it_value.tv_sec = time.sec;
    howlong_.it_value.tv_nsec = time.msec * 1000 * 1000;
    if (timerfd_settime(timerfd_, TFD_TIMER_ABSTIME, &howlong_, NULL) == -1) return false; 
    return true;
}